

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_basePathEndingInForwardSlash_Test::~Importer_basePathEndingInForwardSlash_Test
          (Importer_basePathEndingInForwardSlash_Test *this)

{
  Importer_basePathEndingInForwardSlash_Test *this_local;
  
  ~Importer_basePathEndingInForwardSlash_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, basePathEndingInForwardSlash)
{
    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto importedUnits = parser->parseModel(fileContents("importer/units_imported.cellml"));

    EXPECT_TRUE(importedUnits->hasUnresolvedImports());
    importer->resolveImports(importedUnits, resourcePath("importer/"));
    EXPECT_FALSE(importedUnits->hasUnresolvedImports());
}